

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::LessThanEqualTest<unsigned_long_long,long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  bool bVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffb8
  ;
  uint in_stack_ffffffffffffffc0;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar4;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int *)in_stack_ffffffffffffffb8.m_int);
  rhs.m_int._4_4_ = in_stack_ffffffffffffffc4;
  rhs.m_int._0_4_ = in_stack_ffffffffffffffc0;
  bVar1 = ::operator<=(in_stack_ffffffffffffffb8.m_int,rhs);
  uVar2 = in_stack_ffffffffffffffc0 & 0xffffff;
  uVar3 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) & 0xffffffff00ffffff),
               (int *)in_stack_ffffffffffffffb8.m_int);
    lhs.m_int._4_4_ = in_stack_ffffffffffffffc4;
    lhs.m_int._0_4_ = uVar2;
    bVar1 = ::operator<=(lhs,in_stack_ffffffffffffffb8.m_int);
    uVar3 = uVar2 & 0xffffff;
    if (bVar1) {
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                    *)(CONCAT44(in_stack_ffffffffffffffc4,uVar2) & 0xffffffff00ffffff),
                   (int *)in_stack_ffffffffffffffb8.m_int);
      uVar4 = 7;
      SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(7,uVar3),(int *)in_stack_ffffffffffffffb8.m_int);
      lhs_00.m_int._4_4_ = uVar4;
      lhs_00.m_int._0_4_ = uVar3;
      bVar1 = ::operator<=(lhs_00,in_stack_ffffffffffffffb8);
      uVar3 = (uint)bVar1 << 0x18;
    }
  }
  return SUB41(uVar3 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanEqualTest()
	{
		return
			(U)2 <= SafeInt<T>(3) &&
			SafeInt<T>(4) <= (U)5 &&
			SafeInt<T>(6) <= SafeInt<U>(7);
	}